

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateReturnStatement
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *commandName,
          CommandData *commandData,string *returnVariable,string *returnType,
          string *decoratedReturnType,string *dataType,size_t initialSkipCount,size_t returnParam,
          CommandFlavourFlags flavourFlags,bool enumerating,bool raii)

{
  string *psVar1;
  bool bVar2;
  size_type sVar3;
  const_reference __lhs;
  char *__x;
  bool local_53a;
  bool local_539;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  byte local_4aa;
  allocator<char> local_4a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  allocator<char> local_281;
  string local_280;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_4d;
  CommandFlavourFlagBits local_4c;
  byte local_4b;
  byte local_4a;
  byte local_49;
  bool unique;
  bool raii_local;
  string *psStack_48;
  bool enumerating_local;
  string *returnType_local;
  string *returnVariable_local;
  CommandData *commandData_local;
  string *commandName_local;
  VulkanHppGenerator *this_local;
  string *psStack_18;
  CommandFlavourFlags flavourFlags_local;
  string *returnStatement;
  
  this_local._7_1_ = flavourFlags.m_mask;
  local_49 = enumerating;
  local_4a = raii;
  local_4c = unique;
  psStack_48 = returnType;
  returnType_local = returnVariable;
  returnVariable_local = (string *)commandData;
  commandData_local = (CommandData *)commandName;
  commandName_local = &this->m_api;
  psStack_18 = __return_storage_ptr__;
  local_4b = Flags<CommandFlavourFlagBits>::operator&
                       ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),&local_4c);
  local_4d = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          starts_with((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &returnVariable_local[5].field_2,"Vk");
  if (bVar2) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&returnVariable_local[6].field_2);
    if ((sVar3 == 1) ||
       (((local_49 & 1) != 0 &&
        (sVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&returnVariable_local[6].field_2), sVar3 == 2)))) {
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&returnVariable_local[6].field_2,0);
      bVar2 = std::operator==(__lhs,"VK_SUCCESS");
      if (!bVar2) {
        __assert_fail("commandData.successCodes[0] == \"VK_SUCCESS\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x2979,
                      "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                     );
      }
      if (((local_4a & 1) != 0) ||
         (bVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&returnVariable_local[1].field_2), bVar2)) {
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(returnType_local);
        if (!bVar2) {
          std::operator+(&local_a0,"return ",returnType_local);
          std::operator+(&local_80,&local_a0,";");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_a0);
        }
      }
      else {
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(returnType_local);
        if (bVar2) {
          if (((local_4b ^ 0xff) & 1) == 0) {
            __assert_fail("!unique",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x2985,
                          "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                         );
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,
                     "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result );");
        }
        else if ((local_4b & 1) == 0) {
          std::operator+(&local_200,
                         "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result, std::move( "
                         ,returnType_local);
          std::operator+(&local_1e0,&local_200," ) );");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_200);
        }
        else {
          if (returnParam == 0xffffffffffffffff) {
            __assert_fail("returnParam != INVALID_INDEX",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x298a,
                          "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                         );
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,
                     "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result, ");
          bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  starts_with(dataType,"std::");
          if (bVar2) {
            anon_unknown.dwarf_b1723::startUpperCase(&local_100,returnType_local);
            std::operator+(&local_e0,"std::move( unique",&local_100);
            std::operator+(&local_c0,&local_e0," )");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=(__return_storage_ptr__,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::__cxx11::string::~string((string *)&local_100);
          }
          else {
            bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::starts_with(dataType,"VULKAN_HPP_NAMESPACE::");
            if (!bVar2) {
              __assert_fail("dataType.starts_with( \"VULKAN_HPP_NAMESPACE::\" )",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                            ,0x2992,
                            "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                           );
            }
            std::operator+(&local_1a0,psStack_48,"( ");
            std::operator+(&local_180,&local_1a0,returnType_local);
            std::operator+(&local_160,&local_180,", ");
            generateObjectDeleter
                      (&local_1c0,this,(string *)commandData_local,
                       (CommandData *)returnVariable_local,initialSkipCount,returnParam);
            std::operator+(&local_140,&local_160,&local_1c0);
            std::operator+(&local_120,&local_140," )");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=(__return_storage_ptr__,&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_140);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__," );");
        }
      }
    }
    else {
      bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (returnType_local);
      if (bVar2) {
        if (((local_4b ^ 0xff) & 1) == 0) {
          __assert_fail("!unique",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x29a2,
                        "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                       );
        }
        psVar1 = returnVariable_local + 5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"Vk",&local_281);
        stripPrefix(&local_260,(string *)&psVar1->field_2,&local_280);
        std::operator+(&local_240,"return static_cast<VULKAN_HPP_NAMESPACE::",&local_260);
        std::operator+(&local_220,&local_240,">( result );");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator(&local_281);
      }
      else if ((local_4b & 1) == 0) {
        __x = "ResultValue<";
        if ((local_4a & 1) != 0) {
          __x = "std::pair<VULKAN_HPP_NAMESPACE::Result, ";
        }
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                starts_with(decoratedReturnType,__x);
        local_53a = false;
        if (bVar2) {
          local_53a = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::ends_with
                                (decoratedReturnType,">");
        }
        if (local_53a == false) {
          __assert_fail("decoratedReturnType.starts_with( raii ? \"std::pair<VULKAN_HPP_NAMESPACE::Result, \" : \"ResultValue<\" ) && decoratedReturnType.ends_with( \">\" )"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x29b7,
                        "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                       );
        }
        local_4aa = 0;
        if ((local_4a & 1) == 0) {
          std::__cxx11::string::string((string *)&local_4a8,decoratedReturnType);
        }
        else {
          std::allocator<char>::allocator();
          local_4aa = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4a8,"std::make_pair",&local_4a9);
        }
        std::operator+(&local_488,"return ",&local_4a8);
        std::operator+(&local_468,&local_488,"( result, std::move( ");
        std::operator+(&local_448,&local_468,returnType_local);
        std::operator+(&local_428,&local_448," ) );");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,&local_428);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
        if ((local_4aa & 1) != 0) {
          std::allocator<char>::~allocator(&local_4a9);
        }
      }
      else {
        if (returnParam == 0xffffffffffffffff) {
          __assert_fail("returnParam != INVALID_INDEX",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x29a7,
                        "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                       );
        }
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                starts_with(decoratedReturnType,"ResultValue<");
        local_539 = false;
        if (bVar2) {
          local_539 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::ends_with
                                (decoratedReturnType,">");
        }
        if (local_539 == false) {
          __assert_fail("decoratedReturnType.starts_with( \"ResultValue<\" ) && decoratedReturnType.ends_with( \">\" )"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x29a8,
                        "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                       );
        }
        std::operator+(&local_2c8,"return ",decoratedReturnType);
        std::operator+(&local_2a8,&local_2c8,"( result, ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                starts_with(dataType,"std::");
        if (bVar2) {
          anon_unknown.dwarf_b1723::startUpperCase(&local_328,returnType_local);
          std::operator+(&local_308,"std::move( unique",&local_328);
          std::operator+(&local_2e8,&local_308," )");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,&local_2e8);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)&local_328);
        }
        else {
          std::operator+(&local_3e8,"UniqueHandle<",dataType);
          std::operator+(&local_3c8,&local_3e8,", Dispatch>( ");
          std::operator+(&local_3a8,&local_3c8,returnType_local);
          std::operator+(&local_388,&local_3a8,", ");
          generateObjectDeleter
                    (&local_408,this,(string *)commandData_local,(CommandData *)returnVariable_local
                     ,initialSkipCount,returnParam);
          std::operator+(&local_368,&local_388,&local_408);
          std::operator+(&local_348,&local_368," )");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,&local_348);
          std::__cxx11::string::~string((string *)&local_348);
          std::__cxx11::string::~string((string *)&local_368);
          std::__cxx11::string::~string((string *)&local_408);
          std::__cxx11::string::~string((string *)&local_388);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3e8);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__," );");
      }
    }
  }
  else {
    if (((local_4b ^ 0xff) & 1) == 0) {
      __assert_fail("!unique",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x29be,
                    "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                   );
    }
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (returnType_local);
    if (bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &returnVariable_local[5].field_2,"void");
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,"return result;");
      }
    }
    else {
      std::operator+(&local_4f0,"return ",returnType_local);
      std::operator+(&local_4d0,&local_4f0,";");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,&local_4d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_4f0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateReturnStatement( std::string const & commandName,
                                                         CommandData const & commandData,
                                                         std::string const & returnVariable,
                                                         std::string const & returnType,
                                                         std::string const & decoratedReturnType,
                                                         std::string const & dataType,
                                                         size_t              initialSkipCount,
                                                         size_t              returnParam,
                                                         CommandFlavourFlags flavourFlags,
                                                         bool                enumerating,
                                                         bool                raii ) const
{
  const bool unique = flavourFlags & CommandFlavourFlagBits::unique;

  std::string returnStatement;
  if ( commandData.returnType.starts_with( "Vk" ) )
  {
    if ( ( commandData.successCodes.size() == 1 ) || ( enumerating && ( commandData.successCodes.size() == 2 ) ) )
    {
      assert( commandData.successCodes[0] == "VK_SUCCESS" );
      if ( raii || commandData.errorCodes.empty() )
      {
        if ( !returnVariable.empty() )
        {
          returnStatement = "return " + returnVariable + ";";
        }
      }
      else
      {
        if ( returnVariable.empty() )
        {
          assert( !unique );
          returnStatement = "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result );";
        }
        else if ( unique )
        {
          assert( returnParam != INVALID_INDEX );
          returnStatement = "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result, ";
          if ( dataType.starts_with( "std::" ) )
          {
            returnStatement += "std::move( unique" + startUpperCase( returnVariable ) + " )";
          }
          else
          {
            assert( dataType.starts_with( "VULKAN_HPP_NAMESPACE::" ) );
            returnStatement +=
              returnType + "( " + returnVariable + ", " + generateObjectDeleter( commandName, commandData, initialSkipCount, returnParam ) + " )";
          }
          returnStatement += " );";
        }
        else
        {
          returnStatement = "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result, std::move( " + returnVariable + " ) );";
        }
      }
    }
    else
    {
      if ( returnVariable.empty() )
      {
        assert( !unique );
        returnStatement = "return static_cast<VULKAN_HPP_NAMESPACE::" + stripPrefix( commandData.returnType, "Vk" ) + ">( result );";
      }
      else if ( unique )
      {
        assert( returnParam != INVALID_INDEX );
        assert( decoratedReturnType.starts_with( "ResultValue<" ) && decoratedReturnType.ends_with( ">" ) );
        returnStatement = "return " + decoratedReturnType + "( result, ";
        if ( dataType.starts_with( "std::" ) )
        {
          returnStatement += "std::move( unique" + startUpperCase( returnVariable ) + " )";
        }
        else
        {
          returnStatement += "UniqueHandle<" + dataType + ", Dispatch>( " + returnVariable + ", " +
                             generateObjectDeleter( commandName, commandData, initialSkipCount, returnParam ) + " )";
        }
        returnStatement += " );";
      }
      else
      {
        assert( decoratedReturnType.starts_with( raii ? "std::pair<VULKAN_HPP_NAMESPACE::Result, " : "ResultValue<" ) && decoratedReturnType.ends_with( ">" ) );
        returnStatement = "return " + ( raii ? "std::make_pair" : decoratedReturnType ) + "( result, std::move( " + returnVariable + " ) );";
      }
    }
  }
  else
  {
    assert( !unique );
    if ( returnVariable.empty() )
    {
      if ( commandData.returnType != "void" )
      {
        returnStatement = "return result;";
      }
    }
    else
    {
      returnStatement = "return " + returnVariable + ";";
    }
  }
  return returnStatement;
}